

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptNativeIntArray::GetItemQuery
          (JavascriptNativeIntArray *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  BOOL val;
  PropertyQueryFlags PVar1;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  Var originalInstance_local;
  JavascriptNativeIntArray *this_local;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  val = DirectGetVarItemAt(this,index,value,requestContext);
  PVar1 = JavascriptConversion::BooleanToPropertyQueryFlags(val);
  return PVar1;
}

Assistant:

PropertyQueryFlags JavascriptNativeIntArray::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        return JavascriptConversion::BooleanToPropertyQueryFlags(JavascriptNativeIntArray::DirectGetVarItemAt(index, value, requestContext));
    }